

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_view_test.cpp
# Opt level: O2

void test_detached_view<cornelich::util::buffer_view>(buffer_view *view)

{
  ResultBuilder *pRVar1;
  uint8_t *local_2f8;
  SourceLineInfo local_2f0;
  void *local_2c8;
  ResultBuilder __catchResult;
  
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x1f);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2f0,"view.data() == nullptr",Normal);
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2f8 = view->m_data;
  local_2c8 = (void *)0x0;
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2f0.file._M_string_length = (size_type)&local_2f8;
  pRVar1 = Catch::ExpressionLhs<unsigned_char*const&>::
           captureExpression<(Catch::Internal::Operator)0,decltype(nullptr)>
                     ((ExpressionLhs<unsigned_char*const&> *)&local_2f0,&local_2c8);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x20);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2f0,"view.limit() == 0",Normal);
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2c8 = (void *)((ulong)local_2c8 & 0xffffffff00000000);
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2f0.file._M_string_length = (size_type)&local_2f8;
  local_2f8._0_4_ = view->m_limit;
  pRVar1 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)&local_2f0,(int *)&local_2c8);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x21);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2f0,"view.position() == 0",Normal);
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2f0.file._M_string_length = (size_type)&view->m_position;
  local_2f8._0_4_ = 0;
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  pRVar1 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)&local_2f0,(int *)&local_2f8);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
             ,0x22);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2f0,"view.remaining() == 0",Normal);
  std::__cxx11::string::~string((string *)&local_2f0);
  local_2f8 = (uint8_t *)CONCAT44(local_2f8._4_4_,view->m_limit - view->m_position);
  local_2c8 = (void *)((ulong)local_2c8 & 0xffffffff00000000);
  local_2f0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2f0.file._M_string_length = (size_type)&local_2f8;
  pRVar1 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)&local_2f0,(int *)&local_2c8);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  return;
}

Assistant:

void test_detached_view(T & view)
{
    REQUIRE(view.data() == nullptr);
    REQUIRE(view.limit() == 0);
    REQUIRE(view.position() == 0);
    REQUIRE(view.remaining() == 0);
}